

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::PerspectiveCameraData::PerspectiveCameraData
          (PerspectiveCameraData *this,Vec3fa *from,Vec3fa *to,Vec3fa *up,float fov)

{
  undefined8 uVar1;
  float fov_local;
  Vec3fa *up_local;
  Vec3fa *to_local;
  Vec3fa *from_local;
  PerspectiveCameraData *this_local;
  
  uVar1 = *(undefined8 *)((long)&from->field_0 + 8);
  *(undefined8 *)&(this->from).field_0 = *(undefined8 *)&from->field_0;
  *(undefined8 *)((long)&(this->from).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&to->field_0 + 8);
  *(undefined8 *)&(this->to).field_0 = *(undefined8 *)&to->field_0;
  *(undefined8 *)((long)&(this->to).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&up->field_0 + 8);
  *(undefined8 *)&(this->up).field_0 = *(undefined8 *)&up->field_0;
  *(undefined8 *)((long)&(this->up).field_0 + 8) = uVar1;
  this->fov = fov;
  return;
}

Assistant:

PerspectiveCameraData (const Vec3fa& from, const Vec3fa& to, const Vec3fa& up, const float fov)
        : from(from), to(to), up(up), fov(fov) {}